

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  char *message;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbe0080f172b1f37d
  ;
  local_70.data_ =
       *(AssertHelperData **)(pica::ParticleTypes::types + 8 + (long)particle.typeIndex * 0x10);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"pica::Constants<ChargeType>::electronCharge()",
             "particle.getCharge()",(double *)&local_68,(double *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xb3,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetCharge)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;

    ParticleType particle = this->randomParticle();
    ASSERT_EQ(pica::Constants<ChargeType>::electronCharge(), particle.getCharge());
}